

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

TaprootScriptTree * __thiscall
cfd::core::TaprootScriptTree::operator=(TaprootScriptTree *this,TaprootScriptTree *object)

{
  if (this != object) {
    (this->super_TapBranch).has_leaf_ = (object->super_TapBranch).has_leaf_;
    (this->super_TapBranch).leaf_version_ = (object->super_TapBranch).leaf_version_;
    Script::operator=(&(this->super_TapBranch).script_,&(object->super_TapBranch).script_);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&(this->super_TapBranch).root_commitment_.data_,
               &(object->super_TapBranch).root_commitment_.data_);
    ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::operator=
              (&(this->super_TapBranch).branch_list_,&(object->super_TapBranch).branch_list_);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::operator=
              (&this->nodes_,&object->nodes_);
  }
  return this;
}

Assistant:

TaprootScriptTree& TaprootScriptTree::operator=(
    const TaprootScriptTree& object) & {
  if (this != &object) {
    has_leaf_ = object.has_leaf_;
    leaf_version_ = object.leaf_version_;
    script_ = object.script_;
    root_commitment_ = object.root_commitment_;
    branch_list_ = object.branch_list_;
    nodes_ = object.nodes_;
  }
  return *this;
}